

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * TiXmlBase::ReadName(char *p,TiXmlString *name,TiXmlEncoding encoding)

{
  int iVar1;
  bool bVar2;
  char *start;
  TiXmlEncoding encoding_local;
  TiXmlString *name_local;
  char *p_local;
  
  TiXmlString::operator=(name,"");
  if (p != (char *)0x0) {
    if (((p == (char *)0x0) || (*p == '\0')) ||
       ((iVar1 = IsAlpha(*p,encoding), name_local = (TiXmlString *)p, iVar1 == 0 && (*p != '_')))) {
      p_local = (char *)0x0;
    }
    else {
      while( true ) {
        bVar2 = false;
        if ((name_local != (TiXmlString *)0x0) &&
           (bVar2 = false, *(char *)&name_local->rep_ != '\0')) {
          iVar1 = IsAlphaNum(*(uchar *)&name_local->rep_,encoding);
          bVar2 = true;
          if ((iVar1 == 0) &&
             (((bVar2 = true, *(char *)&name_local->rep_ != '_' &&
               (bVar2 = true, *(char *)&name_local->rep_ != '-')) &&
              (bVar2 = true, *(char *)&name_local->rep_ != '.')))) {
            bVar2 = *(char *)&name_local->rep_ == ':';
          }
        }
        if (!bVar2) break;
        name_local = (TiXmlString *)((long)&name_local->rep_ + 1);
      }
      if (0 < (long)name_local - (long)p) {
        TiXmlString::assign(name,p,(long)name_local - (long)p);
      }
      p_local = (char *)name_local;
    }
    return p_local;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxmlparser.cpp"
                ,0x197,
                "static const char *TiXmlBase::ReadName(const char *, TiXmlString *, TiXmlEncoding)"
               );
}

Assistant:

const char* TiXmlBase::ReadName( const char* p, TIXML_STRING * name, TiXmlEncoding encoding )
{
	// Oddly, not supported on some comilers,
	//name->clear();
	// So use this:
	*name = "";
	assert( p );

	// Names start with letters or underscores.
	// Of course, in unicode, tinyxml has no idea what a letter *is*. The
	// algorithm is generous.
	//
	// After that, they can be letters, underscores, numbers,
	// hyphens, or colons. (Colons are valid ony for namespaces,
	// but tinyxml can't tell namespaces from names.)
	if (    p && *p 
		 && ( IsAlpha( (unsigned char) *p, encoding ) || *p == '_' ) )
	{
		const char* start = p;
		while(		p && *p
				&&	(		IsAlphaNum( (unsigned char ) *p, encoding ) 
						 || *p == '_'
						 || *p == '-'
						 || *p == '.'
						 || *p == ':' ) )
		{
			//(*name) += *p; // expensive
			++p;
		}
		if ( p-start > 0 ) {
			name->assign( start, p-start );
		}
		return p;
	}
	return 0;
}